

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LabelName *name)

{
  string local_48;
  string_view local_28;
  LabelName *local_18;
  LabelName *name_local;
  CWriter *this_local;
  
  local_18 = name;
  name_local = (LabelName *)this;
  GetLocalName(&local_48,this,(name->super_LocalName).name,true);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  Write(this,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CWriter::Write(const LabelName& name) {
  Write(GetLocalName(name.name, true));
}